

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall leveldb::log::_Test_MarginalTrailer2::_Run(_Test_MarginalTrailer2 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string local_228;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [24];
  stringstream local_1b0 [392];
  
  paVar1 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"foo","");
  BigString((string *)local_1c8,&local_228,0x7ff2);
  LogTest::Write(&this->super_LogTest,(string *)local_1c8);
  pcVar2 = local_1c8 + 0x10;
  if ((pointer)local_1c8._0_8_ != pcVar2) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  local_1c8[0] = (string)0x1;
  local_1c8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c8._16_4_ = 0x139;
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_208._M_dataplus._M_p._0_4_ = 0x7ff9;
  local_228._M_dataplus._M_p = (pointer)(this->super_LogTest).dest_.contents_._M_string_length;
  test::Tester::IsEq<int,unsigned_long>
            ((Tester *)local_1c8,(int *)&local_208,(unsigned_long *)&local_228);
  test::Tester::~Tester((Tester *)local_1c8);
  local_1c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"bar","");
  LogTest::Write(&this->super_LogTest,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pcVar2) {
    operator_delete((void *)local_1c8._0_8_);
  }
  local_1c8[0] = (string)0x1;
  local_1c8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c8._16_4_ = 0x13b;
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"foo","");
  BigString(&local_228,&local_208,0x7ff2);
  LogTest::Read_abi_cxx11_(&local_1e8,&this->super_LogTest);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)local_1c8,&local_228,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c8);
  local_1c8[0] = (string)0x1;
  local_1c8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c8._16_4_ = 0x13c;
  std::__cxx11::stringstream::stringstream(local_1b0);
  LogTest::Read_abi_cxx11_(&local_228,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)local_1c8,(char (*) [4])"bar",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c8);
  local_1c8[0] = (string)0x1;
  local_1c8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c8._16_4_ = 0x13d;
  std::__cxx11::stringstream::stringstream(local_1b0);
  LogTest::Read_abi_cxx11_(&local_228,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)local_1c8,(char (*) [4])"EOF",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c8);
  local_1c8[0] = (string)0x1;
  local_1c8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c8._16_4_ = 0x13e;
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_208._M_dataplus._M_p = local_208._M_dataplus._M_p & 0xffffffff00000000;
  local_228._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
  test::Tester::IsEq<int,unsigned_long>
            ((Tester *)local_1c8,(int *)&local_208,(unsigned_long *)&local_228);
  test::Tester::~Tester((Tester *)local_1c8);
  local_1c8[0] = (string)0x1;
  local_1c8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c8._16_4_ = 0x13f;
  std::__cxx11::stringstream::stringstream(local_1b0);
  pcVar2 = (this->super_LogTest).report_.message_._M_dataplus._M_p;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar2,
             pcVar2 + (this->super_LogTest).report_.message_._M_string_length);
  test::Tester::IsEq<char[1],std::__cxx11::string>
            ((Tester *)local_1c8,(char (*) [1])0x10f022,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c8);
  return;
}

Assistant:

TEST(LogTest, MarginalTrailer2) {
  // Make a trailer that is exactly the same length as an empty record.
  const int n = kBlockSize - 2 * kHeaderSize;
  Write(BigString("foo", n));
  ASSERT_EQ(kBlockSize - kHeaderSize, WrittenBytes());
  Write("bar");
  ASSERT_EQ(BigString("foo", n), Read());
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}